

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O3

void mbedtls_asn1_sequence_free(mbedtls_asn1_sequence *seq)

{
  mbedtls_asn1_sequence *pmVar1;
  
  if (seq != (mbedtls_asn1_sequence *)0x0) {
    do {
      pmVar1 = seq->next;
      mbedtls_platform_zeroize(seq,0x20);
      free(seq);
      seq = pmVar1;
    } while (pmVar1 != (mbedtls_asn1_sequence *)0x0);
  }
  return;
}

Assistant:

void mbedtls_asn1_sequence_free( mbedtls_asn1_sequence *seq )
{
    while( seq != NULL )
    {
        mbedtls_asn1_sequence *next = seq->next;
        mbedtls_platform_zeroize( seq, sizeof( *seq ) );
        mbedtls_free( seq );
        seq = next;
    }
}